

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_map_field.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::javanano::(anonymous_namespace)::TypeName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Params *params,
          FieldDescriptor *field,bool boxed)

{
  Type field_type;
  JavaType JVar1;
  Descriptor *pDVar2;
  LogMessage *other;
  JavaType type;
  LogFinisher local_59;
  LogMessage local_58;
  
  field_type = FieldDescriptor::type((FieldDescriptor *)params);
  JVar1 = GetJavaType(field_type);
  if (JVar1 < JAVATYPE_MESSAGE) {
    if ((char)field == '\0') {
      PrimitiveTypeName_abi_cxx11_(__return_storage_ptr__,(javanano *)(ulong)JVar1,type);
    }
    else {
      BoxedPrimitiveTypeName_abi_cxx11_(__return_storage_ptr__,(javanano *)(ulong)JVar1,type);
    }
  }
  else if (JVar1 == JAVATYPE_MESSAGE) {
    pDVar2 = FieldDescriptor::message_type((FieldDescriptor *)params);
    ToJavaName(__return_storage_ptr__,(Params *)this,*(string **)pDVar2,true,
               *(Descriptor **)(pDVar2 + 0x18),*(FileDescriptor **)(pDVar2 + 0x10));
  }
  else {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/javanano/javanano_map_field.cc"
               ,0x44);
    other = internal::LogMessage::operator<<(&local_58,"should not reach here.");
    internal::LogFinisher::operator=(&local_59,other);
    internal::LogMessage::~LogMessage(&local_58);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  return __return_storage_ptr__;
}

Assistant:

string TypeName(const Params& params, const FieldDescriptor* field,
                bool boxed) {
  JavaType java_type = GetJavaType(field);
  switch (java_type) {
    case JAVATYPE_MESSAGE:
      return ClassName(params, field->message_type());
    case JAVATYPE_INT:
    case JAVATYPE_LONG:
    case JAVATYPE_FLOAT:
    case JAVATYPE_DOUBLE:
    case JAVATYPE_BOOLEAN:
    case JAVATYPE_STRING:
    case JAVATYPE_BYTES:
    case JAVATYPE_ENUM:
      if (boxed) {
        return BoxedPrimitiveTypeName(java_type);
      } else {
        return PrimitiveTypeName(java_type);
      }
    // No default because we want the compiler to complain if any new JavaTypes
    // are added..
  }

  GOOGLE_LOG(FATAL) << "should not reach here.";
  return "";
}